

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::Geometry::Geometry
          (Geometry *this,uint64_t id,Element *element,string *name,Document *doc)

{
  pointer *pppBVar1;
  Connection *con;
  iterator __position;
  Skin *pSVar2;
  pointer ppCVar3;
  BlendShape *bsp;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_50
  ;
  BlendShape *local_38;
  
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Geometry_008f3810;
  this->skin = (Skin *)0x0;
  (this->blendShapes).
  super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blendShapes).
  super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->blendShapes).
  super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Document::GetConnectionsByDestinationSequenced(&local_50,doc,(this->super_Object).id,"Deformer");
  if (local_50.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_50.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppCVar3 = local_50.
              super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      con = *ppCVar3;
      pSVar2 = Util::ProcessSimpleConnection<Assimp::FBX::Skin>
                         (con,false,"Skin -> Geometry",element,(char **)0x0);
      if (pSVar2 != (Skin *)0x0) {
        this->skin = pSVar2;
      }
      local_38 = Util::ProcessSimpleConnection<Assimp::FBX::BlendShape>
                           (con,false,"BlendShape -> Geometry",element,(char **)0x0);
      if (local_38 != (BlendShape *)0x0) {
        __position._M_current =
             (this->blendShapes).
             super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->blendShapes).
            super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::FBX::BlendShape_const*,std::allocator<Assimp::FBX::BlendShape_const*>>
          ::_M_realloc_insert<Assimp::FBX::BlendShape_const*const&>
                    ((vector<Assimp::FBX::BlendShape_const*,std::allocator<Assimp::FBX::BlendShape_const*>>
                      *)&this->blendShapes,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          pppBVar1 = &(this->blendShapes).
                      super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppBVar1 = *pppBVar1 + 1;
        }
      }
      ppCVar3 = ppCVar3 + 1;
    } while (ppCVar3 !=
             local_50.
             super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_50.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Geometry::Geometry(uint64_t id, const Element& element, const std::string& name, const Document& doc)
    : Object(id, element, name)
    , skin()
{
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"Deformer");
    for(const Connection* con : conns) {
        const Skin* const sk = ProcessSimpleConnection<Skin>(*con, false, "Skin -> Geometry", element);
        if(sk) {
            skin = sk;
        }
        const BlendShape* const bsp = ProcessSimpleConnection<BlendShape>(*con, false, "BlendShape -> Geometry", element);
        if (bsp) {
            blendShapes.push_back(bsp);
        }
    }
}